

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O1

void __thiscall QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance(iterator *this)

{
  QLatin1String *pQVar1;
  char16_t cVar2;
  uint uVar3;
  CaseSensitivity cs;
  QStringTokenizerBase<QLatin1String,_QChar> *pQVar4;
  QLatin1StringView haystack;
  long lVar5;
  long lVar6;
  long lVar7;
  qsizetype qVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  qsizetype qVar12;
  long in_FS_OFFSET;
  QStringView needle;
  char16_t local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = this->tokenizer;
  lVar6 = (this->current).state.end;
  qVar12 = (this->current).state.extra;
  cVar2 = (pQVar4->m_needle).ucs;
  uVar3 = (pQVar4->super_QStringTokenizerBaseBase).m_sb.
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i;
  cs = (pQVar4->super_QStringTokenizerBaseBase).m_cs;
  pQVar1 = &pQVar4->m_haystack;
  lVar9 = pQVar1->m_size;
  pcVar10 = (pQVar4->m_haystack).m_data;
  haystack.m_size = pQVar1->m_size;
  haystack.m_data = pQVar1->m_data;
  lVar5 = (this->current).state.start;
  do {
    lVar7 = lVar5;
    if (lVar6 < 0) {
      lVar9 = 0;
      pcVar10 = (char *)0x0;
      bVar11 = false;
      goto LAB_00405a21;
    }
    needle.m_data = &local_3a;
    needle.m_size = 1;
    local_3a = cVar2;
    lVar6 = QtPrivate::findString(haystack,lVar7 + qVar12,needle,cs);
    qVar8 = lVar9;
    lVar5 = lVar7;
    if (-1 < lVar6) {
      qVar12 = 0;
      qVar8 = lVar6;
      lVar5 = lVar6 + 1;
    }
  } while (((uVar3 & 1) != 0) && (qVar8 == lVar7));
  lVar9 = qVar8 - lVar7;
  pcVar10 = pcVar10 + lVar7;
  bVar11 = true;
  lVar7 = lVar5;
LAB_00405a21:
  (this->current).value.m_size = lVar9;
  (this->current).value.m_data = pcVar10;
  (this->current).ok = bVar11;
  (this->current).state.start = lVar7;
  (this->current).state.end = lVar6;
  (this->current).state.extra = qVar12;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void advance() {
            Q_ASSERT(current.ok);
            current = tokenizer->next(current.state);
        }